

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestingUtility.h
# Opt level: O0

Particle * __thiscall
BaseParticleFixture<pica::Particle<(pica::Dimension)1>_>::randomParticle
          (BaseParticleFixture<pica::Particle<(pica::Dimension)1>_> *this,PositionType minPosition,
          PositionType maxPosition)

{
  double *pdVar1;
  Particle *in_RDI;
  FP a;
  FP b;
  FP _z;
  FactorType factor;
  MomentumType momentum;
  Real maxMomentum;
  Real minMomentum;
  int d;
  PositionType position;
  FP in_stack_ffffffffffffff70;
  FP in_stack_ffffffffffffff78;
  BaseFixture *in_stack_ffffffffffffff80;
  PositionType *in_stack_ffffffffffffff88;
  Particle *this_00;
  Vector3<double> local_50;
  undefined8 local_38;
  undefined8 local_30;
  int local_24;
  Vector1<double> local_20 [2];
  Vector1<double> local_10;
  Vector1<double> local_8;
  
  this_00 = in_RDI;
  pica::Vector1<double>::Vector1(local_20);
  for (local_24 = 0; local_24 < 1; local_24 = local_24 + 1) {
    pdVar1 = pica::Vector1<double>::operator[](&local_8,local_24);
    in_stack_ffffffffffffff80 = (BaseFixture *)*pdVar1;
    pica::Vector1<double>::operator[](&local_10,local_24);
    in_stack_ffffffffffffff88 =
         (PositionType *)
         BaseFixture::urand(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                            in_stack_ffffffffffffff70);
    pdVar1 = pica::Vector1<double>::operator[](local_20,local_24);
    *pdVar1 = (double)in_stack_ffffffffffffff88;
  }
  local_30 = 0xc024000000000000;
  local_38 = 0x4024000000000000;
  a = BaseFixture::urand(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                         in_stack_ffffffffffffff70);
  b = BaseFixture::urand(in_stack_ffffffffffffff80,a,in_stack_ffffffffffffff70);
  _z = BaseFixture::urand(in_stack_ffffffffffffff80,a,b);
  pica::Vector3<double>::Vector3(&local_50,a,b,_z);
  BaseFixture::urand(in_stack_ffffffffffffff80,a,b);
  pica::Particle<(pica::Dimension)1>::Particle
            (this_00,in_stack_ffffffffffffff88,(MomentumType *)in_stack_ffffffffffffff80,a,
             (TypeIndexType)((ulong)b >> 0x30));
  return in_RDI;
}

Assistant:

Particle randomParticle(PositionType minPosition, PositionType maxPosition)
    {
        PositionType position;
        for (int d = 0; d < dimension; d++)
            position[d] = urand(minPosition[d], maxPosition[d]);
        Real minMomentum = -10;
        Real maxMomentum = 10;
        MomentumType momentum(urand(minMomentum, maxMomentum),
            urand(minMomentum, maxMomentum), urand(minMomentum, maxMomentum));
        FactorType factor = static_cast<FactorType>(urand(1e-5, 1e5));
        return Particle(position, momentum, factor, 0);
    }